

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::Dot_Access_AST_Node::eval_internal(Dot_Access_AST_Node *this,Dispatch_State *t_ss)

{
  int *piVar1;
  __pthread_internal_list *p_Var2;
  __pthread_internal_list *p_Var3;
  undefined8 *puVar4;
  element_type *peVar5;
  string *t_name;
  size_type sVar6;
  undefined1 *puVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [8];
  element_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  undefined8 *puVar12;
  long lVar13;
  ulong uVar14;
  Boxed_Value BVar15;
  initializer_list<chaiscript::Boxed_Value> __l;
  initializer_list<chaiscript::Boxed_Value> __l_00;
  Function_Push_Pop fpp;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> params;
  allocator_type local_e9;
  undefined1 local_e8 [40];
  undefined1 local_c0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [2];
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  undefined1 local_88 [32];
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_68;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_48;
  
  local_98 = in_RDX;
  chaiscript::detail::Dispatch_Engine::new_function_call
            ((Dispatch_Engine *)(in_RDX->_M_dataplus)._M_p,(Stack_Holder *)in_RDX->_M_string_length,
             *(Conversion_Saves **)((long)&in_RDX->field_2 + 8));
  AST_Node::eval(&this->super_AST_Node,
                 (Dispatch_State *)
                 ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.
                 __align);
  local_e8._0_8_ = (this->super_AST_Node)._vptr_AST_Node;
  local_e8._8_8_ =
       (this->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>._M_weak_this.
       super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((element_type *)local_e8._8_8_)->
               super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
               super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((element_type *)local_e8._8_8_)->
                    super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
                    super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((element_type *)local_e8._8_8_)->
               super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
               super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((element_type *)local_e8._8_8_)->
                    super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
                    super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = (iterator)local_e8;
  local_c0 = (undefined1  [8])this;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            (&local_48,__l,(allocator_type *)(local_c0 + 8));
  if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
  }
  p_Var2 = ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.
           __list.__next;
  p_Var3 = p_Var2[6].__prev;
  uVar14 = (long)p_Var2[6].__next - (long)p_Var3;
  local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_ss;
  if (0x10 < uVar14) {
    lVar13 = (long)p_Var3[1].__prev;
    puVar12 = *(undefined8 **)(lVar13 + 0x60);
    puVar4 = *(undefined8 **)(lVar13 + 0x68);
    if (puVar12 != puVar4) {
      do {
        AST_Node::eval((AST_Node *)local_e8,(Dispatch_State *)*puVar12);
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
        emplace_back<chaiscript::Boxed_Value>(&local_48,(Boxed_Value *)local_e8);
        if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
        }
        puVar12 = puVar12 + 2;
      } while (puVar12 != puVar4);
    }
  }
  chaiscript::detail::Dispatch_Engine::save_function_params
            ((Dispatch_Engine *)(local_98->_M_dataplus)._M_p,&local_48);
  _Var11._M_pi = local_90._M_pi;
  auVar10 = local_c0;
  chaiscript::detail::Dispatch_Engine::call_member
            ((Dispatch_Engine *)local_e8,(string *)(in_RDX->_M_dataplus)._M_p,
             (atomic_uint_fast32_t *)&local_90._M_pi[9]._M_use_count,
             (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
             &((Dispatch_State *)(local_90._M_pi + 8))->m_stack_holder,SUB81(&local_48,0),
             (Type_Conversions_State *)(ulong)(0x10 < uVar14));
  uVar9 = local_e8._8_8_;
  uVar8 = local_e8._0_8_;
  local_e8._0_8_ = (element_type *)0x0;
  local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar5 = (((enable_shared_from_this<chaiscript::AST_Node> *)((long)auVar10 + 8))->_M_weak_this).
           super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(undefined8 *)auVar10 = uVar8;
  (((enable_shared_from_this<chaiscript::AST_Node> *)((long)auVar10 + 8))->_M_weak_this).
  super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar9;
  if (peVar5 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
    }
  }
  if (*(int *)&(((((Dispatch_State *)(_Var11._M_pi + 6))->m_engine)._M_data)->m_mutex).super_mutex.
               super___mutex_base._M_mutex.__data.__list.__next[1].__next == 0x12) {
    t_name = (string *)(in_RDX->_M_dataplus)._M_p;
    local_e8._0_8_ = (element_type *)(local_e8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"[]","");
    auVar10 = local_c0;
    local_b8[0]._0_8_ = *(undefined8 *)local_c0;
    local_b8[0]._8_8_ =
         (((enable_shared_from_this<chaiscript::AST_Node> *)((long)local_c0 + 8))->_M_weak_this).
         super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((element_type *)local_b8[0]._8_8_ != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((element_type *)local_b8[0]._8_8_)->
                 super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
                 super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(((element_type *)local_b8[0]._8_8_)->
                      super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
                      super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((element_type *)local_b8[0]._8_8_)->
                 super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
                 super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(((element_type *)local_b8[0]._8_8_)->
                      super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
                      super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      }
    }
    AST_Node::eval((AST_Node *)(local_c0 + 0x18),
                   (Dispatch_State *)
                   (((((Dispatch_State *)(_Var11._M_pi + 6))->m_engine)._M_data)->m_mutex).
                   super_mutex.super___mutex_base._M_mutex.__data.__list.__next[6].__prev[1].__prev)
    ;
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)(local_c0 + 8);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
              (&local_68,__l_00,&local_e9);
    chaiscript::detail::Dispatch_Engine::call_function
              ((Dispatch_Engine *)local_88,t_name,(atomic_uint_fast32_t *)local_e8,
               (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               (_Var11._M_pi + 9),(Type_Conversions_State *)&local_68);
    uVar9 = local_88._8_8_;
    uVar8 = local_88._0_8_;
    local_88._0_8_ = (_Base_ptr)0x0;
    local_88._8_8_ = (element_type *)0x0;
    peVar5 = (((enable_shared_from_this<chaiscript::AST_Node> *)((long)auVar10 + 8))->_M_weak_this).
             super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(undefined8 *)auVar10 = uVar8;
    (((enable_shared_from_this<chaiscript::AST_Node> *)((long)auVar10 + 8))->_M_weak_this).
    super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar9;
    if (peVar5 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5);
      if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
    }
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
              (&local_68);
    lVar13 = 0x20;
    do {
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_c0 + lVar13) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_c0 + lVar13));
      }
      lVar13 = lVar13 + -0x10;
    } while (lVar13 != 0);
    if ((element_type *)local_e8._0_8_ != (element_type *)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
    }
  }
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&local_48)
  ;
  sVar6 = local_98->_M_string_length;
  puVar7 = *(undefined1 **)((long)&local_98->field_2 + 8);
  piVar1 = (int *)(sVar6 + 0x30);
  *piVar1 = *piVar1 + -1;
  _Var11._M_pi = extraout_RDX;
  if (*piVar1 == 0) {
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::clear
              ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               (*(long *)(sVar6 + 0x20) + -0x18));
    *puVar7 = 0;
    _Var11._M_pi = extraout_RDX_00;
  }
  BVar15.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var11._M_pi;
  BVar15.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)local_c0;
  return (Boxed_Value)
         BVar15.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{
          chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);


          Boxed_Value retval = children[0]->eval(t_ss);
          std::vector<Boxed_Value> params{retval};

          bool has_function_params = false;
          if (children[2]->children.size() > 1) {
            has_function_params = true;
            for (const auto &child : children[2]->children[1]->children) {
              params.push_back(child->eval(t_ss));
            }
          }

          fpp.save_params(params);

          try {
            retval = t_ss->call_member(m_fun_name, m_loc, std::move(params), has_function_params, t_ss.conversions());
          }
          catch(const exception::dispatch_error &e){
            if (e.functions.empty())
            {
              throw exception::eval_error("'" + m_fun_name + "' is not a function.");
            } else {
              throw exception::eval_error(std::string(e.what()) + " for function '" + m_fun_name + "'", e.parameters, e.functions, true, *t_ss);
            }
          }
          catch(detail::Return_Value &rv) {
            retval = std::move(rv.retval);
          }

          if (this->children[2]->identifier == AST_Node_Type::Array_Call) {
            try {
              retval = t_ss->call_function("[]", m_array_loc, {retval, this->children[2]->children[1]->eval(t_ss)}, t_ss.conversions());
            }
            catch(const exception::dispatch_error &e){
              throw exception::eval_error("Can not find appropriate array lookup operator '[]'.", e.parameters, e.functions, true, *t_ss);
            }
          }

          return retval;
        }